

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O3

void __thiscall TcpConnection::do_write(TcpConnection *this)

{
  OutputBuffer *this_00;
  int iVar1;
  
  this_00 = &this->tc_obuf;
  while( true ) {
    iVar1 = BufferBase::length(&this_00->super_BufferBase);
    if (iVar1 == 0) break;
    iVar1 = OutputBuffer::write2fd(this_00,this->tc_fd);
    if (iVar1 == 0) break;
    if (iVar1 == -1) {
      if (-1 < pr_level) {
        printf("[%-5s][%s:%d] write2fd error, close conn!\n","error","do_write",0x53);
      }
      do_close(this);
      return;
    }
  }
  iVar1 = BufferBase::length(&this_00->super_BufferBase);
  if (iVar1 != 0) {
    return;
  }
  Epoll::epoll_del((this->tc_loop->el_epoller).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,this->tc_fd,4);
  return;
}

Assistant:

void TcpConnection::do_write() {
    while (tc_obuf.length()) {
        int ret;
        if (ret = tc_obuf.write2fd(tc_fd); ret == -1) {
            PR_ERROR("write2fd error, close conn!\n");
            this->do_close();
            return ;
        }
        if (ret == 0) {
            break;
        }
    }

    if (tc_obuf.length() == 0) {
        tc_loop->del_from_poller(tc_fd, EPOLLOUT);
    }

    return;    
}